

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Amap_ManProduceNetwork(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMapping)

{
  uint uVar1;
  undefined8 *puVar2;
  char *pName;
  uint uVar3;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar4;
  Abc_Ntk_t *pNtk_00;
  uint *__ptr;
  void *pvVar5;
  void **ppvVar6;
  Abc_Obj_t *pObj;
  ulong uVar7;
  ulong uVar8;
  Mio_Library_t *pMVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint local_54;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  iVar12 = vMapping->nSize;
  if (0 < iVar12) {
    lVar10 = 0;
    do {
      puVar2 = (undefined8 *)vMapping->pArray[lVar10];
      pName = (char *)*puVar2;
      if (pName != (char *)0x0) {
        pMVar9 = pLib;
        pMVar4 = Mio_LibraryReadGateByName(pLib,pName,(char *)0x0);
        if (pMVar4 == (Mio_Gate_t *)0x0) {
          Abc_Print((int)pMVar9,"Current library does not contain gate \"%s\".\n",*puVar2);
          return (Abc_Ntk_t *)0x0;
        }
        iVar12 = vMapping->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar12);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
  pNtk_00->pManFunc = pLib;
  uVar1 = vMapping->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar1 - 1) {
    uVar13 = (ulong)uVar1;
  }
  __ptr[1] = 0;
  uVar11 = (uint)uVar13;
  *__ptr = uVar11;
  uVar3 = 0;
  if (uVar11 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar11 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  local_54 = 0;
  if (0 < (int)uVar1) {
    uVar8 = 0;
    local_54 = 0;
    uVar3 = 0;
    do {
      puVar2 = (undefined8 *)vMapping->pArray[uVar8];
      if (*(short *)(puVar2 + 1) == 1) {
        if (((int)local_54 < 0) || (pNtk_00->vCos->nSize <= (int)local_54)) {
LAB_002a3720:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar6 = pNtk_00->vCos->pArray;
        uVar11 = local_54 + 1;
        uVar1 = uVar3;
        uVar3 = local_54;
LAB_002a35aa:
        local_54 = uVar11;
        pObj = (Abc_Obj_t *)ppvVar6[uVar3];
        uVar3 = uVar1;
      }
      else {
        if (*(short *)(puVar2 + 1) == -1) {
          if (((int)uVar3 < 0) || (pNtk_00->vCis->nSize <= (int)uVar3)) goto LAB_002a3720;
          ppvVar6 = pNtk_00->vCis->pArray;
          uVar11 = local_54;
          uVar1 = uVar3 + 1;
          goto LAB_002a35aa;
        }
        pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        pMVar4 = Mio_LibraryReadGateByName(pLib,(char *)*puVar2,(char *)0x0);
        (pObj->field_5).pData = pMVar4;
      }
      if (0 < *(short *)((long)puVar2 + 10)) {
        lVar10 = 0;
        do {
          iVar12 = *(int *)((long)puVar2 + lVar10 * 4 + 0xc);
          if (((long)iVar12 < 0) || ((int)uVar8 <= iVar12)) goto LAB_002a3720;
          Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)iVar12 * 8));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(short *)((long)puVar2 + 10));
      }
      iVar12 = (int)uVar13;
      if ((int)uVar8 == iVar12) {
        if (iVar12 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = 0x10;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar12 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(uVar13 * 8);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),uVar13 * 8);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = iVar12 * 2;
        }
      }
      else {
        pvVar5 = *(void **)(__ptr + 2);
      }
      uVar7 = uVar8 & 0xffffffff;
      uVar8 = uVar8 + 1;
      __ptr[1] = (uint)uVar8;
      *(Abc_Obj_t **)((long)pvVar5 + uVar7 * 8) = pObj;
    } while ((long)uVar8 < (long)vMapping->nSize);
    pvVar5 = *(void **)(__ptr + 2);
  }
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
  }
  free(__ptr);
  if (uVar3 == pNtk_00->vCis->nSize) {
    if (local_54 == pNtk_00->vCos->nSize) {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      return pNtk_00;
    }
    __assert_fail("iPos == Abc_NtkCoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                  ,0x118e,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  __assert_fail("iPis == Abc_NtkCiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                ,0x118d,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Amap_ManProduceNetwork( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMapping )
{
//    extern void * Abc_FrameReadLibGen();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Amap_Out_t * pRes;
    Vec_Ptr_t * vNodesNew;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNodeNew, * pFaninNew;
    int i, k, iPis, iPos, nDupGates;
    // make sure gates exist in the current library
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
        if ( pRes->pName && Mio_LibraryReadGateByName( pLib, pRes->pName, NULL ) == NULL )
        {
            Abc_Print( 1, "Current library does not contain gate \"%s\".\n", pRes->pName );
            return NULL;
        }
    // create the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_MAP );
    pNtkNew->pManFunc = pLib;
    iPis = iPos = 0;
    vNodesNew = Vec_PtrAlloc( Vec_PtrSize(vMapping) );
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
    {
        if ( pRes->Type == -1 )
            pNodeNew = Abc_NtkCi( pNtkNew, iPis++ );
        else if ( pRes->Type == 1 )
            pNodeNew = Abc_NtkCo( pNtkNew, iPos++ );
        else
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Mio_LibraryReadGateByName( pLib, pRes->pName, NULL );
        }
        for ( k = 0; k < pRes->nFans; k++ )
        {
            pFaninNew = (Abc_Obj_t *)Vec_PtrEntry( vNodesNew, pRes->pFans[k] );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        Vec_PtrPush( vNodesNew, pNodeNew );
    }
    Vec_PtrFree( vNodesNew );
    assert( iPis == Abc_NtkCiNum(pNtkNew) );
    assert( iPos == Abc_NtkCoNum(pNtkNew) );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
//    if ( nDupGates && Map_ManReadVerbose(pMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    return pNtkNew;
}